

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O1

double deqp::gles31::Functional::FmaCase::fma(double __x,double __y,double __z)

{
  FloatFormat *this;
  bool bVar1;
  bool bVar2;
  double dVar3;
  double dVar4;
  bool bVar5;
  deRoundingMode dVar6;
  int in_ESI;
  Interval *in_RDI;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double extraout_XMM0_Qa;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double local_248;
  double local_238;
  Interval ib;
  Interval ia;
  double local_1f8;
  Interval ic;
  double local_1c8;
  double local_1b8;
  Interval res;
  double local_158;
  double local_148;
  double local_128;
  Interval local_110;
  double local_f8;
  undefined8 uStack_f0;
  double local_e8;
  undefined8 uStack_e0;
  Interval local_d8;
  Interval local_c0;
  FloatFormat local_a8 [3];
  
  tcu::FloatFormat::FloatFormat(local_a8,0,0,7,false,YES,MAYBE,MAYBE);
  tcu::FloatFormat::FloatFormat(local_a8 + 1,-0xd,0xd,9,false,MAYBE,MAYBE,MAYBE);
  tcu::FloatFormat::FloatFormat(local_a8 + 2,-0x7e,0x7f,0x17,true,MAYBE,YES,MAYBE);
  ib.m_hasNaN = NAN(SUB84(__x,0));
  dVar11 = (double)SUB84(__x,0);
  local_238 = INFINITY;
  ib.m_lo = INFINITY;
  if (!ib.m_hasNaN) {
    ib.m_lo = dVar11;
  }
  this = local_a8 + in_ESI;
  local_248 = -INFINITY;
  ib.m_hi = -INFINITY;
  if (!ib.m_hasNaN) {
    ib.m_hi = dVar11;
  }
  tcu::FloatFormat::convert(&ia,this,&ib);
  dVar11 = (double)SUB84(__y,0);
  ic.m_hasNaN = NAN(SUB84(__y,0));
  ic.m_lo = INFINITY;
  if (!ic.m_hasNaN) {
    ic.m_lo = dVar11;
  }
  ic.m_hi = -INFINITY;
  if (!ic.m_hasNaN) {
    ic.m_hi = dVar11;
  }
  tcu::FloatFormat::convert(&ib,this,&ic);
  res.m_hasNaN = NAN(SUB84(__z,0));
  dVar11 = (double)SUB84(__z,0);
  if (!res.m_hasNaN) {
    local_238 = dVar11;
  }
  res.m_lo = local_238;
  if (!res.m_hasNaN) {
    local_248 = dVar11;
  }
  res.m_hi = local_248;
  tcu::FloatFormat::convert(&ic,this,&res);
  res.m_hasNaN = false;
  res.m_lo = INFINITY;
  res.m_hi = -INFINITY;
  dVar6 = deGetRoundingMode();
  deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
  dVar16 = ia.m_lo;
  dVar11 = ib.m_lo;
  deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
  dVar16 = dVar16 * dVar11;
  bVar5 = NAN(dVar16);
  local_1f8 = -INFINITY;
  local_e8 = -INFINITY;
  if (!bVar5) {
    local_e8 = dVar16;
  }
  uStack_e0 = 0;
  local_1b8 = INFINITY;
  local_f8 = INFINITY;
  if (!bVar5) {
    local_f8 = dVar16;
  }
  uStack_f0 = 0;
  dVar11 = ia.m_lo * ib.m_lo;
  if (!NAN(dVar11)) {
    local_1f8 = dVar11;
    local_1b8 = dVar11;
  }
  deSetRoundingMode(dVar6);
  dVar6 = deGetRoundingMode();
  deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
  dVar12 = ia.m_lo;
  dVar16 = ib.m_hi;
  deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
  dVar12 = dVar12 * dVar16;
  local_128 = -INFINITY;
  if (!NAN(dVar12)) {
    local_128 = dVar12;
  }
  dVar16 = ia.m_lo * ib.m_hi;
  local_148 = INFINITY;
  if (!NAN(dVar16)) {
    local_148 = dVar16;
  }
  deSetRoundingMode(dVar6);
  dVar6 = deGetRoundingMode();
  deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
  dVar13 = ia.m_hi;
  dVar14 = ib.m_lo;
  deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
  dVar13 = dVar13 * dVar14;
  local_1c8 = -INFINITY;
  if (!NAN(dVar13)) {
    local_1c8 = dVar13;
  }
  dVar14 = ia.m_hi * ib.m_lo;
  local_158 = INFINITY;
  if (!NAN(dVar14)) {
    local_158 = dVar14;
  }
  deSetRoundingMode(dVar6);
  dVar6 = deGetRoundingMode();
  deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
  dVar24 = ia.m_hi;
  dVar20 = ib.m_hi;
  deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
  dVar23 = ia.m_hi;
  dVar21 = ib.m_hi;
  deSetRoundingMode(dVar6);
  dVar4 = (double)(-(ulong)NAN(dVar12) & 0x7ff0000000000000 | ~-(ulong)NAN(dVar12) & (ulong)dVar12);
  dVar22 = (double)(~-(ulong)NAN(dVar16) & (ulong)dVar16 | -(ulong)NAN(dVar16) & 0xfff0000000000000)
  ;
  uVar7 = -(ulong)(dVar4 <= local_148);
  uVar8 = -(ulong)(dVar22 <= local_128);
  dVar19 = (double)(-(ulong)NAN(dVar13) & 0x7ff0000000000000 | ~-(ulong)NAN(dVar13) & (ulong)dVar13)
  ;
  dVar3 = (double)(~-(ulong)NAN(dVar14) & (ulong)dVar14 | -(ulong)NAN(dVar14) & 0xfff0000000000000);
  uVar9 = -(ulong)(dVar19 <= local_158);
  uVar10 = -(ulong)(dVar3 <= local_1c8);
  dVar24 = dVar24 * dVar20;
  bVar1 = NAN(dVar24);
  dVar20 = -INFINITY;
  if (!bVar1) {
    dVar20 = dVar24;
  }
  dVar17 = (double)(~-(ulong)(local_f8 <= local_1b8) & (ulong)local_1b8 |
                   (ulong)local_f8 & -(ulong)(local_f8 <= local_1b8));
  dVar15 = (double)(~-(ulong)(local_1f8 <= local_e8) & (ulong)local_1f8 |
                   (ulong)local_e8 & -(ulong)(local_1f8 <= local_e8));
  dVar18 = (double)(~uVar7 & (ulong)local_148 | uVar7 & (ulong)dVar4);
  dVar4 = (double)(~uVar8 & (ulong)dVar22 | (ulong)local_128 & uVar8);
  dVar19 = (double)(~uVar9 & (ulong)local_158 | uVar9 & (ulong)dVar19);
  dVar3 = (double)(~uVar10 & (ulong)dVar3 | (ulong)local_1c8 & uVar10);
  dVar23 = dVar23 * dVar21;
  dVar22 = INFINITY;
  if (!bVar1) {
    dVar22 = dVar24;
  }
  bVar2 = NAN(dVar23);
  dVar21 = -INFINITY;
  if (!bVar2) {
    dVar21 = dVar23;
  }
  dVar20 = (double)(~-(ulong)(dVar21 <= dVar20) & (ulong)dVar21 |
                   (ulong)dVar20 & -(ulong)(dVar21 <= dVar20));
  dVar21 = INFINITY;
  if (!bVar2) {
    dVar21 = dVar23;
  }
  dVar21 = (double)(~-(ulong)(dVar22 <= dVar21) & (ulong)dVar21 |
                   (ulong)dVar22 & -(ulong)(dVar22 <= dVar21));
  uVar7 = -(ulong)(dVar17 <= dVar18);
  dVar22 = (double)(~uVar7 & (ulong)dVar18 | uVar7 & (ulong)dVar17);
  uVar7 = -(ulong)(dVar4 <= dVar15);
  dVar4 = (double)(~uVar7 & (ulong)dVar4 | uVar7 & (ulong)dVar15);
  uVar7 = -(ulong)(dVar22 <= dVar19);
  dVar22 = (double)(~uVar7 & (ulong)dVar19 | uVar7 & (ulong)dVar22);
  uVar7 = -(ulong)(dVar3 <= dVar4);
  dVar3 = (double)(~uVar7 & (ulong)dVar3 | uVar7 & (ulong)dVar4);
  local_110.m_hasNaN =
       (bVar1 || bVar2) ||
       (((NAN(dVar16) || NAN(dVar13)) || NAN(dVar14)) || ((bVar5 || NAN(dVar11)) || NAN(dVar12)));
  uVar7 = -(ulong)(dVar22 <= dVar21);
  local_110.m_lo = (double)(uVar7 & (ulong)dVar22 | ~uVar7 & (ulong)dVar21);
  uVar7 = -(ulong)(dVar20 <= dVar3);
  local_110.m_hi = (double)(uVar7 & (ulong)dVar3 | ~uVar7 & (ulong)dVar20);
  bVar5 = false;
  if ((ia.m_lo != -INFINITY) && (ia.m_hi != INFINITY)) {
    bVar5 = ib.m_hi != INFINITY && ib.m_lo != -INFINITY;
  }
  tcu::FloatFormat::roundOut(&local_c0,this,&local_110,bVar5);
  tcu::FloatFormat::convert(&local_d8,this,&local_c0);
  dVar6 = deGetRoundingMode();
  deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
  dVar11 = ic.m_lo;
  deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
  dVar11 = dVar11 + local_d8.m_lo;
  bVar5 = NAN(dVar11);
  dVar16 = -INFINITY;
  if (!bVar5) {
    dVar16 = dVar11;
  }
  dVar12 = INFINITY;
  if (!bVar5) {
    dVar12 = dVar11;
  }
  dVar13 = ic.m_hi + local_d8.m_hi;
  dVar11 = INFINITY;
  dVar14 = -INFINITY;
  if (!NAN(dVar13)) {
    dVar11 = dVar13;
    dVar14 = dVar13;
  }
  res.m_hasNaN = bVar5 || NAN(dVar13);
  res.m_lo = (double)(~-(ulong)(dVar12 <= dVar11) & (ulong)dVar11 |
                     (ulong)dVar12 & -(ulong)(dVar12 <= dVar11));
  res.m_hi = (double)(~-(ulong)(dVar14 <= dVar16) & (ulong)dVar14 |
                     (ulong)dVar16 & -(ulong)(dVar14 <= dVar16));
  deSetRoundingMode(dVar6);
  bVar5 = false;
  if ((local_d8.m_lo != -INFINITY) && (local_d8.m_hi != INFINITY)) {
    bVar5 = ic.m_hi != INFINITY && ic.m_lo != -INFINITY;
  }
  tcu::FloatFormat::roundOut(&local_d8,this,&res,bVar5);
  tcu::FloatFormat::convert(in_RDI,this,&local_d8);
  return extraout_XMM0_Qa;
}

Assistant:

static tcu::Interval fma (glu::Precision precision, float a, float b, float c)
	{
		const tcu::FloatFormat formats[] =
		{
			//				 minExp		maxExp		mantissa	exact,		subnormals	infinities	NaN
			tcu::FloatFormat(0,			0,			7,			false,		tcu::YES,	tcu::MAYBE,	tcu::MAYBE),
			tcu::FloatFormat(-13,		13,			9,			false,		tcu::MAYBE,	tcu::MAYBE,	tcu::MAYBE),
			tcu::FloatFormat(-126,		127,		23,			true,		tcu::MAYBE, tcu::YES,	tcu::MAYBE)
		};
		const tcu::FloatFormat&	format	= de::getSizedArrayElement<glu::PRECISION_LAST>(formats, precision);
		const tcu::Interval		ia		= format.convert(a);
		const tcu::Interval		ib		= format.convert(b);
		const tcu::Interval		ic		= format.convert(c);
		tcu::Interval			prod0;
		tcu::Interval			prod1;
		tcu::Interval			prod2;
		tcu::Interval			prod3;
		tcu::Interval			prod;
		tcu::Interval			res;

		TCU_SET_INTERVAL(prod0, tmp, tmp = ia.lo() * ib.lo());
		TCU_SET_INTERVAL(prod1, tmp, tmp = ia.lo() * ib.hi());
		TCU_SET_INTERVAL(prod2, tmp, tmp = ia.hi() * ib.lo());
		TCU_SET_INTERVAL(prod3, tmp, tmp = ia.hi() * ib.hi());

		prod = format.convert(format.roundOut(prod0 | prod1 | prod2 | prod3, ia.isFinite() && ib.isFinite()));

		TCU_SET_INTERVAL_BOUNDS(res, tmp,
								tmp = prod.lo() + ic.lo(),
								tmp = prod.hi() + ic.hi());

		return format.convert(format.roundOut(res, prod.isFinite() && ic.isFinite()));
	}